

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

_Bool array_array_container_lazy_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  array_container_t *paVar4;
  bitset_container_t *pbVar5;
  array_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  uint64_t *words;
  undefined4 in_stack_ffffffffffffffd8;
  byte bVar6;
  undefined1 local_1;
  
  iVar3 = *in_RDI + *in_RSI;
  if (iVar3 < 0x401) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
    *(array_container_t **)in_RDX = paVar4;
    lVar1._0_4_ = in_RDX->cardinality;
    lVar1._4_4_ = in_RDX->capacity;
    if (lVar1 == 0) {
      local_1 = true;
    }
    else {
      array_container_union
                (in_RDX,(array_container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0);
      local_1 = false;
    }
  }
  else {
    pbVar5 = bitset_container_create();
    *(bitset_container_t **)in_RDX = pbVar5;
    bVar6 = 1;
    lVar2._0_4_ = in_RDX->cardinality;
    lVar2._4_4_ = in_RDX->capacity;
    if (lVar2 != 0) {
      words = *(uint64_t **)in_RDX;
      bitset_set_list(words,(uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0x16b617);
      bitset_set_list(words,(uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0x16b636);
      *(undefined4 *)words = 0xffffffff;
    }
    local_1 = (_Bool)(bVar6 & 1);
  }
  return local_1;
}

Assistant:

bool array_array_container_lazy_union(const array_container_t *src_1,
                                      const array_container_t *src_2,
                                      container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    //
    // We assume that operations involving bitset containers will be faster than
    // operations involving solely array containers, except maybe when array
    // containers are small. Indeed, for example, it is cheap to compute the
    // union between an array and a bitset container, generally more so than
    // between a large array and another array. So it is advantageous to favour
    // bitset containers during the computation. Of course, if we convert array
    // containers eagerly to bitset containers, we may later need to revert the
    // bitset containers to array containerr to satisfy the Roaring format
    // requirements, but such one-time conversions at the end may not be overly
    // expensive. We arrived to this design based on extensive benchmarking.
    //
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) {
            array_container_union(src_1, src_2, CAST_array(*dst));
        } else {
            return true;  // otherwise failure won't be caught
        }
        return false;  // not a bitset
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}